

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_api.c
# Opt level: O3

WORD32 ihevcd_set_display_frame(iv_obj_t *ps_codec_obj,void *pv_api_ip,void *pv_api_op)

{
  uint uVar1;
  void *pvVar2;
  WORD32 WVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long *plVar8;
  long *pv_ptr;
  
  pvVar2 = ps_codec_obj->pv_codec_handle;
  *(undefined4 *)((long)pvVar2 + 0x34) = 0;
  if (*(int *)((long)pvVar2 + 0x38) != 0) {
    uVar1 = *(uint *)((long)pv_api_ip + 8);
    uVar6 = 0x40;
    if (uVar1 < 0x40) {
      uVar6 = uVar1;
    }
    *(uint *)((long)pvVar2 + 0x34) = uVar6;
    pv_ptr = *(long **)((long)pvVar2 + 0x140);
    if (*(int *)((long)pvVar2 + 0x3c) == 1) {
      lVar4 = (**(code **)((long)pvVar2 + 0x3f48))
                        (*(undefined8 *)((long)pvVar2 + 0x3f58),0x80,
                         *(int *)((long)pv_api_ip + 0x21c) * uVar6 * 2);
      if (lVar4 == 0) {
        return 1;
      }
      *(long *)((long)pvVar2 + 0x158) = lVar4;
    }
    else {
      lVar4 = 0;
    }
    if (uVar1 != 0) {
      plVar8 = (long *)((long)pv_api_ip + 0x20);
      uVar7 = 0;
      do {
        *pv_ptr = plVar8[-1];
        if (*(int *)((long)pvVar2 + 0x3c) == 1) {
          lVar5 = lVar4;
          lVar4 = (ulong)(uint)(*(int *)((long)pv_api_ip + 0x21c) * 2) + lVar4;
        }
        else {
          lVar5 = *plVar8;
        }
        pv_ptr[1] = lVar5;
        WVar3 = ihevc_buf_mgr_add(*(buf_mgr_t **)((long)pvVar2 + 0x138),pv_ptr,(WORD32)uVar7);
        if (WVar3 != 0) {
          *(undefined4 *)((long)pvVar2 + 0x90) = 0x3d7;
          return 0x3d7;
        }
        ihevc_buf_mgr_set_status(*(buf_mgr_t **)((long)pvVar2 + 0x138),(WORD32)uVar7,4);
        memcpy((void *)((long)pvVar2 + (long)*(int *)((long)pvVar2 + 0x106b0) * 0x308 + 0x44b0),
               plVar8 + -2,0x308);
        *(int *)((long)pvVar2 + 0x106b0) = *(int *)((long)pvVar2 + 0x106b0) + 1;
        uVar7 = uVar7 + 1;
        plVar8 = plVar8 + 0x61;
        pv_ptr = pv_ptr + 0x3e0;
      } while (uVar6 != uVar7);
    }
  }
  *(undefined4 *)((long)pv_api_op + 4) = 0;
  return 0;
}

Assistant:

WORD32 ihevcd_set_display_frame(iv_obj_t *ps_codec_obj,
                                void *pv_api_ip,
                                void *pv_api_op)
{
    WORD32 ret = IV_SUCCESS;

    ivd_set_display_frame_ip_t *ps_dec_disp_ip;
    ivd_set_display_frame_op_t *ps_dec_disp_op;

    WORD32 i;

    codec_t *ps_codec = (codec_t *)(ps_codec_obj->pv_codec_handle);

    ps_dec_disp_ip = (ivd_set_display_frame_ip_t *)pv_api_ip;
    ps_dec_disp_op = (ivd_set_display_frame_op_t *)pv_api_op;

    ps_codec->i4_num_disp_bufs = 0;
    if(ps_codec->i4_share_disp_buf)
    {
        UWORD32 num_bufs = ps_dec_disp_ip->num_disp_bufs;
        pic_buf_t *ps_pic_buf;
        UWORD8 *pu1_buf;
        WORD32 buf_ret;

        UWORD8 *pu1_chroma_buf = NULL;
        num_bufs = MIN(num_bufs, BUF_MGR_MAX_CNT);
        ps_codec->i4_num_disp_bufs = num_bufs;

        ps_pic_buf = (pic_buf_t *)ps_codec->ps_pic_buf;

        /* If color format is 420P, then allocate chroma buffers to hold semiplanar
         * chroma data */
        if(ps_codec->e_chroma_fmt == IV_YUV_420P)
        {
            WORD32 num_samples = ps_dec_disp_ip->s_disp_buffer[0].u4_min_out_buf_size[1] << 1;
            WORD32 size = num_samples * num_bufs;
            void *pv_mem_ctxt = ps_codec->pv_mem_ctxt;

            pu1_chroma_buf = ps_codec->pf_aligned_alloc(pv_mem_ctxt, 128, size);
            RETURN_IF((NULL == pu1_chroma_buf), IV_FAIL);

            ps_codec->pu1_cur_chroma_ref_buf = pu1_chroma_buf;
        }
        for(i = 0; i < (WORD32)num_bufs; i++)
        {
            /* Stride is not available in some cases here.
               So store base pointers to buffer manager now,
               and update these pointers once header is decoded */
            pu1_buf =  ps_dec_disp_ip->s_disp_buffer[i].pu1_bufs[0];
            ps_pic_buf->pu1_luma = pu1_buf;

            if(ps_codec->e_chroma_fmt == IV_YUV_420P)
            {
                pu1_buf = pu1_chroma_buf;
                pu1_chroma_buf += ps_dec_disp_ip->s_disp_buffer[0].u4_min_out_buf_size[1] << 1;
            }
            else
            {
                /* For YUV 420SP case use display buffer itself as chroma ref buffer */
                pu1_buf =  ps_dec_disp_ip->s_disp_buffer[i].pu1_bufs[1];
            }

            ps_pic_buf->pu1_chroma = pu1_buf;

            buf_ret = ihevc_buf_mgr_add((buf_mgr_t *)ps_codec->pv_pic_buf_mgr, ps_pic_buf, i);

            if(0 != buf_ret)
            {
                ps_codec->i4_error_code = IHEVCD_BUF_MGR_ERROR;
                return IHEVCD_BUF_MGR_ERROR;
            }

            /* Mark pic buf as needed for display */
            /* This ensures that till the buffer is explicitly passed to the codec,
             * application owns the buffer. Decoder is allowed to use a buffer only
             * when application sends it through fill this buffer call in OMX
             */
            ihevc_buf_mgr_set_status((buf_mgr_t *)ps_codec->pv_pic_buf_mgr, i, BUF_MGR_DISP);

            ps_pic_buf++;

            /* Store display buffers in codec context. Needed for 420p output */
            memcpy(&ps_codec->s_disp_buffer[ps_codec->i4_share_disp_buf_cnt],
                   &ps_dec_disp_ip->s_disp_buffer[i],
                   sizeof(ps_dec_disp_ip->s_disp_buffer[i]));

            ps_codec->i4_share_disp_buf_cnt++;

        }
    }

    ps_dec_disp_op->u4_error_code = 0;
    return ret;

}